

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.cpp
# Opt level: O0

void sumprobs(obj_info *info,int bound,char *name)

{
  obj_info *endp;
  char *name_local;
  obj_info *poStack_10;
  int bound_local;
  obj_info *info_local;
  
  poStack_10 = info;
  while (poStack_10 + 1 < info + bound) {
    poStack_10[1].oi_prob = poStack_10->oi_prob + poStack_10[1].oi_prob;
    poStack_10 = poStack_10 + 1;
  }
  return;
}

Assistant:

void sumprobs(struct obj_info *info, int bound, const char *name)
{
#ifdef DEBUG
    struct obj_info *start = info;
#endif
    struct obj_info *endp;

    endp = info + bound;
    while (++info < endp)
        info->oi_prob += (info - 1)->oi_prob;
#ifdef DEBUG
    badcheck(name, start, bound);
#endif
}